

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

bool hgdb::json::SymbolTable::has_same_var(ScopeBase *scope,VarStmt *stmt)

{
  function<bool_(hgdb::json::ScopeBase_*)> local_50;
  undefined1 local_30 [8];
  anon_class_16_2_f7e9cd5a match_func;
  bool match;
  VarStmt *stmt_local;
  ScopeBase *scope_local;
  
  match_func.stmt._7_1_ = 0;
  local_30 = (undefined1  [8])((long)&match_func.stmt + 7);
  match_func.match = (bool *)stmt;
  std::function<bool(hgdb::json::ScopeBase*)>::
  function<hgdb::json::SymbolTable::has_same_var(hgdb::json::ScopeBase*,hgdb::json::VarStmt&)::_lambda(hgdb::json::ScopeBase*)_1_&,void>
            ((function<bool(hgdb::json::ScopeBase*)> *)&local_50,
             (anon_class_16_2_f7e9cd5a *)local_30);
  walk_up<true>(scope,&local_50);
  std::function<bool_(hgdb::json::ScopeBase_*)>::~function(&local_50);
  return (bool)(match_func.stmt._7_1_ & 1);
}

Assistant:

static bool has_same_var(ScopeBase *scope, VarStmt &stmt) {
        bool match = false;
        auto match_func = [&match, &stmt](ScopeBase *s) {
            if (s->type() == "decl" || s->type() == "assign") {
                auto const &ref = *reinterpret_cast<VarStmt *>(s);
                if (stmt == ref) {
                    match = true;
                    return true;
                }
            }
            return false;
        };
        walk_up<true>(scope, match_func);

        return match;
    }